

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O0

bool __thiscall
QCache<QString,_QConfFile>::insert
          (QCache<QString,_QConfFile> *this,QString *key,QConfFile *object,qsizetype cost)

{
  long lVar1;
  Node *n_00;
  long in_RCX;
  void *in_RDX;
  char *in_RSI;
  QConfFile *in_RDI;
  long in_FS_OFFSET;
  qsizetype prevCost;
  Node *n;
  InsertionResult result;
  qsizetype in_stack_ffffffffffffff98;
  Data<QCache<QString,_QConfFile>::Node> *in_stack_ffffffffffffffa8;
  bool local_21;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((long)(in_RDI->addedKeys).d.d.ptr < in_RCX) {
    remove((QCache<QString,_QConfFile> *)in_RDI,in_RSI);
    if (in_RDX != (void *)0x0) {
      QConfFile::~QConfFile(in_RDI);
      operator_delete(in_RDX,0x60);
    }
    local_21 = false;
  }
  else {
    trim((QCache<QString,_QConfFile> *)in_RDI,in_stack_ffffffffffffff98);
    QHashPrivate::Data<QCache<QString,_QConfFile>::Node>::findOrInsert<QString>
              (in_stack_ffffffffffffffa8,&in_RDI->name);
    n_00 = QHashPrivate::iterator<QCache<QString,_QConfFile>::Node>::node
                     ((iterator<QCache<QString,_QConfFile>::Node> *)in_RDI);
    Node::createInPlace(n_00,(QString *)in_stack_ffffffffffffffa8,in_RDI,in_stack_ffffffffffffff98);
    (n_00->super_Chain).prev = (Chain *)in_RDI;
    (n_00->super_Chain).next = (Chain *)(in_RDI->name).d.ptr;
    ((Chain *)(in_RDI->name).d.ptr)->prev = &n_00->super_Chain;
    (in_RDI->name).d.ptr = (char16_t *)n_00;
    (in_RDI->removedKeys).d.d.ptr =
         (QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>
          *)((long)&(((in_RDI->removedKeys).d.d.ptr)->super_QSharedData).ref.
                    super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + in_RCX);
    local_21 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_21;
}

Assistant:

bool insert(const Key &key, T *object, qsizetype cost = 1)
    {
        if (cost > mx) {
            remove(key);
            delete object;
            return false;
        }
        trim(mx - cost);
        auto result = d.findOrInsert(key);
        Node *n = result.it.node();
        if (result.initialized) {
            auto prevCost = n->value.cost;
            result.it.node()->emplace(object, cost);
            cost -= prevCost;
            relink(key);
        } else {
            Node::createInPlace(n, key, object, cost);
            n->prev = &chain;
            n->next = chain.next;
            chain.next->prev = n;
            chain.next = n;
        }
        total += cost;
        return true;
    }